

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<float> fmt::v8::detail::dragonbox::to_decimal<float>(float x)

{
  carrier_uint two_f;
  undefined1 auVar1 [16];
  carrier_uint two_f_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  byte bVar7;
  int minus_k;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  char cVar15;
  cache_entry_type cache;
  
  uVar8 = (uint)x & 0x7fffff;
  if (((uint)x & 0x7f800000) == 0) {
    uVar14 = 0xffffff6b;
    if (uVar8 == 0) {
      uVar9 = 0;
      uVar11 = 0;
      goto LAB_00118d64;
    }
LAB_00118ab6:
    uVar3 = floor_log10_pow2(uVar14);
    uVar9 = (ulong)uVar3;
    minus_k = uVar3 - 1;
    uVar6 = cache_accessor<float>::get_cached_power(1 - uVar3);
    cache = uVar6;
    iVar4 = floor_log2_pow10(1 - uVar3);
    iVar4 = iVar4 + uVar14;
    two_f_00 = uVar8 * 2;
    two_f = uVar8 * 2 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    auVar1 = ZEXT416(two_f << ((byte)iVar4 & 0x1f)) * auVar1;
    uVar11 = (auVar1._8_8_ & 0xffffffff) / 100;
    uVar10 = (uint)uVar11;
    uVar12 = uVar10 * -100 + auVar1._8_4_;
    uVar13 = (uint)(uVar6 >> (~(byte)iVar4 & 0x3f));
    if (uVar13 < uVar12) {
LAB_00118ccb:
      uVar8 = (uVar12 - (uVar13 >> 1)) + 5;
      if ((uVar8 & 1) == 0) {
        uVar8 = (uVar8 >> 1) * 0xcccd;
        uVar12 = (uVar8 >> 0x12) + uVar10 * 10;
        uVar11 = (ulong)uVar12;
        if ((uVar8 & 0xfffc) < 0x3334) {
          bVar2 = cache_accessor<float>::compute_mul_parity(two_f_00,&cache,iVar4);
          if (bVar2) {
            bVar2 = is_center_integer<float>(two_f_00,uVar14,minus_k);
            if (bVar2) {
              uVar11 = (ulong)(uVar12 & 0xfffffffe);
            }
          }
          else {
            uVar11 = (ulong)(uVar12 - 1);
          }
        }
      }
      else {
        uVar5 = small_division_by_pow10<1>(uVar8);
        uVar11 = (ulong)(uVar5 + uVar10 * 10);
      }
      goto LAB_00118d64;
    }
    if (uVar12 < uVar13) {
      if (((uVar12 == 0) && ((uVar8 & 1) != 0)) &&
         (bVar2 = is_endpoint_integer<float>(two_f,uVar14,minus_k), bVar2)) {
        uVar10 = uVar10 - 1;
        uVar12 = 100;
        goto LAB_00118ccb;
      }
    }
    else if ((((uVar8 & 1) != 0) ||
             (bVar2 = is_endpoint_integer<float>(two_f_00 - 1,uVar14,minus_k), !bVar2)) &&
            (bVar2 = cache_accessor<float>::compute_mul_parity(two_f_00 - 1,&cache,iVar4), !bVar2))
    goto LAB_00118ccb;
    iVar4 = uVar3 + 1;
    uVar8 = 0;
    if ((uVar10 | 0x80) != 0) {
      for (; ((uVar10 | 0x80) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    uVar14 = 0;
    while ((uVar3 = (uint)uVar11, uVar12 = uVar8 & 0xfffffffe, (int)uVar14 < (int)(uVar8 - 1) &&
           (uVar12 = uVar14, uVar3 * -0x3d70a3d7 < 0xa3d70a4))) {
      uVar14 = uVar14 + 2;
      uVar11 = (ulong)(uVar3 * -0x3d70a3d7);
    }
  }
  else {
    uVar14 = (((uint)x & 0x7f800000) >> 0x17) - 0x96;
    if (uVar8 != 0) {
      uVar8 = uVar8 | 0x800000;
      goto LAB_00118ab6;
    }
    uVar8 = floor_log10_pow2_minus_log10_4_over_3(uVar14);
    uVar9 = (ulong)uVar8;
    iVar4 = floor_log2_pow10(-uVar8);
    cVar15 = (char)iVar4 + (char)uVar14;
    uVar6 = cache_accessor<float>::get_cached_power(-uVar8);
    bVar7 = 0x28 - cVar15;
    uVar12 = (uint)((uVar14 & 0xfffffffe) != 2) + (int)(uVar6 - (uVar6 >> 0x19) >> (bVar7 & 0x3f));
    uVar10 = 0;
    uVar11 = ((uVar6 >> 0x18) + uVar6 >> (bVar7 & 0x3f) & 0xffffffff) / 10;
    if ((uint)uVar11 * 10 < uVar12) {
      uVar8 = (int)(uVar6 >> (0x27U - cVar15 & 0x3f)) + 1U >> 1;
      if (uVar14 == 0xffffffdd) {
        uVar8 = uVar8 & 0xfffffffe;
      }
      else {
        uVar8 = uVar8 + (uVar8 < uVar12);
      }
      uVar11 = (ulong)uVar8;
      goto LAB_00118d64;
    }
    iVar4 = uVar8 + 1;
    uVar14 = (uint)uVar11 | 0x80;
    uVar8 = 0;
    if (uVar14 != 0) {
      for (; (uVar14 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    while ((uVar3 = (uint)uVar11, uVar12 = uVar8 & 0xfffffffe, (int)uVar10 < (int)(uVar8 - 1) &&
           (uVar12 = uVar10, uVar3 * -0x3d70a3d7 < 0xa3d70a4))) {
      uVar10 = uVar10 + 2;
      uVar11 = (ulong)(uVar3 * -0x3d70a3d7);
    }
  }
  if (uVar12 < uVar8) {
    uVar8 = uVar3 * -0x33333333;
    if (uVar8 < 0x33333334) {
      uVar3 = uVar8;
    }
    uVar12 = uVar12 | uVar8 < 0x33333334;
  }
  uVar11 = (ulong)(uVar3 >> ((byte)uVar12 & 0x1f));
  uVar9 = (ulong)(iVar4 + uVar12);
LAB_00118d64:
  return (decimal_fp<float>)(uVar11 | uVar9 << 0x20);
}

Assistant:

FMT_CONSTEXPR inline uint64_t multiply(uint64_t lhs, uint64_t rhs) {
#if FMT_USE_INT128
  auto product = static_cast<__uint128_t>(lhs) * rhs;
  auto f = static_cast<uint64_t>(product >> 64);
  return (static_cast<uint64_t>(product) & (1ULL << 63)) != 0 ? f + 1 : f;
#else
  // Multiply 32-bit parts of significands.
  uint64_t mask = (1ULL << 32) - 1;
  uint64_t a = lhs >> 32, b = lhs & mask;
  uint64_t c = rhs >> 32, d = rhs & mask;
  uint64_t ac = a * c, bc = b * c, ad = a * d, bd = b * d;
  // Compute mid 64-bit of result and round.
  uint64_t mid = (bd >> 32) + (ad & mask) + (bc & mask) + (1U << 31);
  return ac + (ad >> 32) + (bc >> 32) + (mid >> 32);
#endif
}